

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

bool VulkanUtilities::anon_unknown_1::EnumerateInstanceExtensions
               (char *LayerName,
               vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions)

{
  PFN_vkEnumerateInstanceExtensionProperties p_Var1;
  VkResult VVar2;
  VkExtensionProperties *pVVar3;
  ulong uVar4;
  size_type sVar5;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  uint32_t ExtensionCount;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions_local;
  char *LayerName_local;
  
  msg.field_2._12_4_ = 0;
  VVar2 = (*vkEnumerateInstanceExtensionProperties)
                    (LayerName,(uint32_t *)(msg.field_2._M_local_buf + 0xc),
                     (VkExtensionProperties *)0x0);
  if (VVar2 == VK_SUCCESS) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              (Extensions,(ulong)(uint)msg.field_2._12_4_);
    p_Var1 = vkEnumerateInstanceExtensionProperties;
    pVVar3 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::data
                       (Extensions);
    VVar2 = (*p_Var1)(LayerName,(uint32_t *)(msg.field_2._M_local_buf + 0xc),pVVar3);
    if (VVar2 == VK_SUCCESS) {
      uVar4 = (ulong)(uint)msg.field_2._12_4_;
      sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                        (Extensions);
      if (uVar4 != sVar5) {
        Diligent::FormatString<char[165]>
                  ((string *)local_48,
                   (char (*) [165])
                   "The number of extensions written by vkEnumerateInstanceExtensionProperties is not consistent with the count returned in the first call. This is a Vulkan loader bug."
                  );
        Message = (Char *)std::__cxx11::string::c_str();
        Diligent::DebugAssertionFailed
                  (Message,"EnumerateInstanceExtensions",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                   ,0x8a);
        std::__cxx11::string::~string((string *)local_48);
      }
      LayerName_local._7_1_ = true;
    }
    else {
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::clear(Extensions);
      LayerName_local._7_1_ = false;
    }
  }
  else {
    LayerName_local._7_1_ = false;
  }
  return LayerName_local._7_1_;
}

Assistant:

bool EnumerateInstanceExtensions(const char* LayerName, std::vector<VkExtensionProperties>& Extensions)
{
    uint32_t ExtensionCount = 0;

    if (vkEnumerateInstanceExtensionProperties(LayerName, &ExtensionCount, nullptr) != VK_SUCCESS)
        return false;

    Extensions.resize(ExtensionCount);
    if (vkEnumerateInstanceExtensionProperties(LayerName, &ExtensionCount, Extensions.data()) != VK_SUCCESS)
    {
        Extensions.clear();
        return false;
    }
    VERIFY(ExtensionCount == Extensions.size(),
           "The number of extensions written by vkEnumerateInstanceExtensionProperties is not consistent "
           "with the count returned in the first call. This is a Vulkan loader bug.");

    return true;
}